

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O1

void __thiscall QHttp2Connection::handleRST_STREAM(QHttp2Connection *this)

{
  QHttp2Connection *this_00;
  byte bVar1;
  Entry *pEVar2;
  int *piVar3;
  QObject *pQVar4;
  QHttp2Stream *this_01;
  uint *puVar5;
  uint uVar6;
  long in_FS_OFFSET;
  quint32 streamID;
  quint32 local_50;
  uint local_4c;
  TryEmplaceResult local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x238;
  local_50 = Http2::Frame::streamID((Frame *)this_00);
  if (local_50 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      connectionError(this,PROTOCOL_ERROR,"RST_STREAM on 0x0");
      return;
    }
  }
  else {
    puVar5 = (uint *)Http2::Frame::dataBegin((Frame *)this_00);
    uVar6 = *puVar5;
    QHash<unsigned_int,QPointer<QHttp2Stream>>::tryEmplace_impl<unsigned_int_const&>
              (&local_48,this + 0x1c0,&local_50);
    pEVar2 = (local_48.iterator.i.d)->spans[local_48.iterator.i.bucket >> 7].entries;
    bVar1 = (local_48.iterator.i.d)->spans[local_48.iterator.i.bucket >> 7].offsets
            [(uint)local_48.iterator.i.bucket & 0x7f];
    piVar3 = *(int **)(pEVar2[bVar1].storage.data + 8);
    if (piVar3 != (int *)0x0) {
      pQVar4 = *(QObject **)(pEVar2[bVar1].storage.data + 0x10);
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
      if ((piVar3[1] != 0) && (pQVar4 != (QObject *)0x0)) {
        local_4c = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        local_48.iterator.i.bucket = (size_t)&local_4c;
        local_48.iterator.i.d =
             (Data<QHashPrivate::Node<unsigned_int,_QPointer<QHttp2Stream>_>_> *)0x0;
        QMetaObject::activate(pQVar4,&QHttp2Stream::staticMetaObject,7,(void **)&local_48);
      }
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          operator_delete(piVar3);
        }
      }
    }
    if (((*(int *)(this + 0x10) == 0 ^ (byte)local_50) & 1) == 0) {
      uVar6 = *(int *)(this + 0x210) - 2;
    }
    else {
      uVar6 = *(uint *)(this + 0x2ac);
    }
    if (uVar6 < local_50) {
      connectionError(this,PROTOCOL_ERROR,"RST_STREAM on idle stream");
    }
    else {
      QHash<unsigned_int,QPointer<QHttp2Stream>>::tryEmplace_impl<unsigned_int_const&>
                (&local_48,this + 0x1c0,&local_50);
      pEVar2 = (local_48.iterator.i.d)->spans[local_48.iterator.i.bucket >> 7].entries;
      bVar1 = (local_48.iterator.i.d)->spans[local_48.iterator.i.bucket >> 7].offsets
              [(uint)local_48.iterator.i.bucket & 0x7f];
      piVar3 = *(int **)(pEVar2[bVar1].storage.data + 8);
      if (piVar3 != (int *)0x0) {
        this_01 = *(QHttp2Stream **)(pEVar2[bVar1].storage.data + 0x10);
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
        if ((piVar3[1] != 0) && (this_01 != (QHttp2Stream *)0x0)) {
          QHttp2Stream::handleRST_STREAM(this_01,(Frame *)this_00);
        }
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            operator_delete(piVar3);
          }
        }
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QHttp2Connection::handleRST_STREAM()
{
    Q_ASSERT(inboundFrame.type() == FrameType::RST_STREAM);

    // RFC 9113, 6.4: RST_STREAM frames MUST be associated with a stream.
    // If a RST_STREAM frame is received with a stream identifier of 0x0,
    // the recipient MUST treat this as a connection error (Section 5.4.1)
    // of type PROTOCOL_ERROR.
    const auto streamID = inboundFrame.streamID();
    if (streamID == connectionStreamID)
        return connectionError(PROTOCOL_ERROR, "RST_STREAM on 0x0");

    // RFC 9113, 6.4: A RST_STREAM frame with a length other than 4 octets MUST be treated as a
    // connection error (Section 5.4.1) of type FRAME_SIZE_ERROR.
    // checked in Frame::validateHeader()
    Q_ASSERT(inboundFrame.payloadSize() == 4);

    const auto error = qFromBigEndian<quint32>(inboundFrame.dataBegin());
    if (QPointer<QHttp2Stream> stream = m_streams[streamID])
        emit stream->rstFrameRecived(error);

    // Verify that whatever stream is being RST'd is not in the idle state:
    const quint32 lastRelevantStreamID = [this, streamID]() {
        quint32 peerMask = m_connectionType == Type::Client ? 0 : 1;
        return ((streamID & 1) == peerMask) ? m_lastIncomingStreamID : m_nextStreamID - 2;
    }();
    if (streamID > lastRelevantStreamID) {
        // "RST_STREAM frames MUST NOT be sent for a stream
        // in the "idle" state. .. the recipient MUST treat this
        // as a connection error (Section 5.4.1) of type PROTOCOL_ERROR."
        return connectionError(PROTOCOL_ERROR, "RST_STREAM on idle stream");
    }

    Q_ASSERT(inboundFrame.dataSize() == 4);

    if (QPointer<QHttp2Stream> stream = m_streams[streamID])
        stream->handleRST_STREAM(inboundFrame);
}